

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Promise<void> __thiscall
kj::Promise<void>::attach<kj::Own<kj::AsyncOutputStream>,kj::String>
          (Promise<void> *this,Own<kj::AsyncOutputStream> *attachments,String *attachments_1)

{
  Own<kj::_::PromiseNode> *params;
  Own<kj::AsyncOutputStream> *this_00;
  Own<kj::AsyncOutputStream> *params_00;
  String *in_RCX;
  PromiseNode *extraout_RDX;
  Promise<void> PVar1;
  ExpandAndApplyResult<kj::_::MakeTupleFunc,_kj::Own<kj::AsyncOutputStream>,_kj::String> local_70;
  Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::String>_>_>
  local_48;
  Own<kj::_::PromiseNode> local_38;
  String *local_28;
  String *attachments_local_1;
  Own<kj::AsyncOutputStream> *attachments_local;
  Promise<void> *this_local;
  
  local_28 = in_RCX;
  attachments_local_1 = attachments_1;
  attachments_local = attachments;
  this_local = this;
  params = mv<kj::Own<kj::_::PromiseNode>>((Own<kj::_::PromiseNode> *)attachments);
  this_00 = fwd<kj::Own<kj::AsyncOutputStream>>
                      ((NoInfer<kj::Own<kj::AsyncOutputStream>_> *)attachments_local_1);
  params_00 = (Own<kj::AsyncOutputStream> *)fwd<kj::String>(local_28);
  tuple<kj::Own<kj::AsyncOutputStream>,kj::String>(&local_70,(kj *)this_00,params_00,in_RCX);
  heap<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,kj::String>>,kj::Own<kj::_::PromiseNode>,kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,kj::String>>
            ((kj *)&local_48,params,&local_70);
  Own<kj::_::PromiseNode>::
  Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,kj::String>>,void>
            (&local_38,&local_48);
  Promise(this,false,&local_38);
  Own<kj::_::PromiseNode>::~Own(&local_38);
  Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::String>_>_>::
  ~Own(&local_48);
  _::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::String>::~Tuple(&local_70);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false, kj::heap<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
      kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}